

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestMoreStuff::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined6 in_register_00000032;
  DispatchCallResult DVar3;
  undefined8 uVar2;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffffffff) {
  case 0:
    (**(code **)(lVar1 + 0x10))(this);
    uVar2 = extraout_RDX;
    break;
  case 1:
    (**(code **)(lVar1 + 0x18))(this);
    uVar2 = extraout_RDX_10;
    break;
  case 2:
    (**(code **)(lVar1 + 0x20))(this);
    uVar2 = extraout_RDX_06;
    goto LAB_002ebaeb;
  case 3:
    (**(code **)(lVar1 + 0x28))(this);
    uVar2 = extraout_RDX_08;
    break;
  case 4:
    (**(code **)(lVar1 + 0x30))(this);
    uVar2 = extraout_RDX_03;
    break;
  case 5:
    (**(code **)(lVar1 + 0x38))(this);
    uVar2 = extraout_RDX_11;
    break;
  case 6:
    (**(code **)(lVar1 + 0x40))(this);
    uVar2 = extraout_RDX_13;
    break;
  case 7:
    (**(code **)(lVar1 + 0x48))(this);
    uVar2 = extraout_RDX_09;
LAB_002ebaeb:
    *(undefined2 *)&this->field_0x8 = 0x100;
    goto LAB_002ebb5c;
  case 8:
    (**(code **)(lVar1 + 0x50))(this);
    uVar2 = extraout_RDX_15;
    break;
  case 9:
    (**(code **)(lVar1 + 0x58))(this);
    uVar2 = extraout_RDX_05;
    break;
  case 10:
    (**(code **)(lVar1 + 0x60))(this);
    uVar2 = extraout_RDX_14;
    break;
  case 0xb:
    (**(code **)(lVar1 + 0x68))(this);
    uVar2 = extraout_RDX_02;
    break;
  case 0xc:
    (**(code **)(lVar1 + 0x70))(this);
    uVar2 = extraout_RDX_04;
    break;
  case 0xd:
    (**(code **)(lVar1 + 0x78))(this);
    uVar2 = extraout_RDX_12;
    break;
  case 0xe:
    (**(code **)(lVar1 + 0x80))(this);
    uVar2 = extraout_RDX_01;
    break;
  case 0xf:
    (**(code **)(lVar1 + 0x88))(this);
    uVar2 = extraout_RDX_07;
    break;
  case 0x10:
    (**(code **)(lVar1 + 0x90))(this);
    uVar2 = extraout_RDX_00;
    break;
  default:
    DVar3 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)((long)CONCAT62(in_register_00000032,methodId) +
                               *(long *)(lVar1 + -0x18)),0x578698,0x33cf);
    uVar2 = DVar3._8_8_;
    goto LAB_002ebb5c;
  }
  *(undefined2 *)&this->field_0x8 = 0;
LAB_002ebb5c:
  DVar3.isStreaming = (bool)(char)uVar2;
  DVar3.allowCancellation = (bool)(char)((ulong)uVar2 >> 8);
  DVar3._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  DVar3.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar3;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestMoreStuff::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        callFoo(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::CallFooParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallFooResults>(context)),
        false,
        false
      };
    case 1:
      return {
        callFooWhenResolved(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>(context)),
        false,
        false
      };
    case 2:
      return {
        neverReturn(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,  ::capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>(context)),
        false,
        true
      };
    case 3:
      return {
        hold(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::HoldParams,  ::capnproto_test::capnp::test::TestMoreStuff::HoldResults>(context)),
        false,
        false
      };
    case 4:
      return {
        callHeld(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>(context)),
        false,
        false
      };
    case 5:
      return {
        getHeld(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>(context)),
        false,
        false
      };
    case 6:
      return {
        echo(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::EchoParams,  ::capnproto_test::capnp::test::TestMoreStuff::EchoResults>(context)),
        false,
        false
      };
    case 7:
      return {
        expectCancel(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,  ::capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>(context)),
        false,
        true
      };
    case 8:
      return {
        methodWithDefaults(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,  ::capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>(context)),
        false,
        false
      };
    case 9:
      return {
        getHandle(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>(context)),
        false,
        false
      };
    case 10:
      return {
        getNull(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetNullParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetNullResults>(context)),
        false,
        false
      };
    case 11:
      return {
        getEnormousString(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>(context)),
        false,
        false
      };
    case 12:
      return {
        methodWithNullDefault(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,  ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>(context)),
        false,
        false
      };
    case 13:
      return {
        writeToFd(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::WriteToFdParams,  ::capnproto_test::capnp::test::TestMoreStuff::WriteToFdResults>(context)),
        false,
        false
      };
    case 14:
      return {
        throwException(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>(context)),
        false,
        false
      };
    case 15:
      return {
        throwRemoteException(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>(context)),
        false,
        false
      };
    case 16:
      return {
        throwExceptionWithDetail(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestMoreStuff",
          0xddc70bf9784133cfull, methodId);
  }
}